

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

int OpenMD::findBegin(istream *theStream,char *startText)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  char readLine [1024];
  char local_438 [1032];
  
  bVar4 = false;
  std::istream::seekg((long)theStream,_S_beg);
  if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) == 0) {
    std::ios::widen((char)theStream->_vptr_basic_istream[-3] + (char)theStream);
    std::istream::getline((char *)theStream,(long)local_438,'\0');
    uVar3 = 1;
    do {
      if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) != 0) {
LAB_001f96b4:
        printf("Error fast forwarding stream at line %d: stream ended unexpectedly.\n",(ulong)uVar3)
        ;
        goto LAB_001f96c4;
      }
      pcVar2 = strtok(local_438," ,;\t");
      if (((pcVar2 != (char *)0x0) && (iVar1 = strcasecmp("begin",pcVar2), iVar1 == 0)) &&
         (pcVar2 = strtok((char *)0x0," ,;\t"), pcVar2 != (char *)0x0)) {
        iVar1 = strcasecmp(startText,pcVar2);
        bVar4 = iVar1 == 0;
      }
      if (!bVar4) {
        if (((&theStream->field_0x20)[(long)theStream->_vptr_basic_istream[-3]] & 2) != 0)
        goto LAB_001f96b4;
        std::ios::widen((char)theStream->_vptr_basic_istream[-3] + (char)theStream);
        std::istream::getline((char *)theStream,(long)local_438,'\0');
        uVar3 = uVar3 + 1;
      }
    } while (!bVar4);
  }
  else {
    puts("Error fast forwarding stream: stream is empty.");
LAB_001f96c4:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

int findBegin(std::istream& theStream, const char* startText) {
    const int MAXLEN = 1024;
    char readLine[MAXLEN];
    int foundText = 0;
    int lineNum;
    char* the_token;

    // rewind the stream
    theStream.seekg(0, std::ios::beg);
    lineNum = 0;

    if (!theStream.eof()) {
      theStream.getline(readLine, MAXLEN);
      lineNum++;
    } else {
      printf("Error fast forwarding stream: stream is empty.\n");
      return -1;
    }

    while (!foundText) {
      if (theStream.eof()) {
        printf("Error fast forwarding stream at line %d: "
               "stream ended unexpectedly.\n",
               lineNum);
        return -1;
      }

      the_token = strtok(readLine, " ,;\t");
      if (the_token != NULL)
        if (!strcasecmp("begin", the_token)) {
          the_token = strtok(NULL, " ,;\t");
          if (the_token != NULL) {
            foundText = !strcasecmp(startText, the_token);
          }
        }

      if (!foundText) {
        if (!theStream.eof()) {
          theStream.getline(readLine, MAXLEN);
          lineNum++;
        } else {
          printf("Error fast forwarding stream at line %d: "
                 "stream ended unexpectedly.\n",
                 lineNum);
          return -1;
        }
      }
    }
    return lineNum;
  }